

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

object_t * __thiscall
acto::core::runtime_t::create_actor
          (runtime_t *this,unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *body,
          actor_thread thread_opt)

{
  atomic<unsigned_long> *paVar1;
  long lVar2;
  int iVar3;
  object_t *this_00;
  worker_t *this_01;
  __hashtable *__h_1;
  long *in_FS_OFFSET;
  object_t *result;
  __node_gen_type __node_gen;
  object_t *local_38;
  _Head_base<0UL,_acto::actor_*,_false> local_30;
  _Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_28;
  
  this_00 = (object_t *)operator_new(0x68);
  local_30._M_head_impl =
       (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
       super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
       super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl;
  (body->_M_t).super___uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_>._M_t.
  super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl = (actor *)0x0;
  object_t::object_t(this_00,thread_opt,
                     (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)&local_30);
  if (local_30._M_head_impl != (actor *)0x0) {
    (*(local_30._M_head_impl)->_vptr_actor[1])();
  }
  local_30._M_head_impl = (actor *)0x0;
  local_38 = this_00;
  if (thread_opt == bind) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      __cxx_global_var_init();
    }
    if ((char)in_FS_OFFSET[-2] == '\0') {
      lVar2 = *in_FS_OFFSET;
      LOCK();
      (local_38->references).super___atomic_base<unsigned_long>._M_i =
           (local_38->references).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      if ((char)in_FS_OFFSET[-1] == '\0') {
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        __cxx_global_var_init();
      }
      local_28 = (_Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)(lVar2 + -0x48);
      std::
      _Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<acto::core::object_t*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<acto::core::object_t*,false>>>>
                (local_28,&local_38);
      return local_38;
    }
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 == 0) {
    local_28 = (_Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->actors_;
    std::
    _Hashtable<acto::core::object_t*,acto::core::object_t*,std::allocator<acto::core::object_t*>,std::__detail::_Identity,std::equal_to<acto::core::object_t*>,std::hash<acto::core::object_t*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<acto::core::object_t*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<acto::core::object_t*,false>>>>
              (local_28,&local_38);
    event::reset(&this->no_actors_event_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if (thread_opt == exclusive) {
      this_01 = create_worker(this);
      local_38->field_0x60 = local_38->field_0x60 | 8;
      local_38->thread = this_01;
      LOCK();
      paVar1 = &(this->workers_).reserved;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
      worker_t::assign(this_01,local_38,(duration)0x1dcd6500);
    }
    return local_38;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

object_t* runtime_t::create_actor(std::unique_ptr<actor> body,
                                  const actor_thread thread_opt) {
  object_t* const result = new core::object_t(thread_opt, std::move(body));
  // Bind actor to the current thread if the thread did not created by the
  // library.
  if (thread_opt == actor_thread::bind && !thread_context.is_worker_thread) {
    result->references += 1;
    thread_context.actors.insert(result);
  } else {
    {
      std::lock_guard<std::mutex> g(mutex_);

      actors_.insert(result);

      no_actors_event_.reset();
    }
    // Create dedicated thread for the actor if necessary.
    if (thread_opt == actor_thread::exclusive) {
      worker_t* const worker = create_worker();

      result->scheduled = true;
      result->thread = worker;

      ++workers_.reserved;

      worker->assign(result, std::chrono::milliseconds(500));
    }
  }

  return result;
}